

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int firLowpassFilter(StkFrames *src,StkFrames *dst,double stopband,double initial_value)

{
  size_t sVar1;
  StkFloat *pSVar2;
  double dVar3;
  StkFloat SVar4;
  int iStack_400c4;
  int iStack_400c0;
  int i_4;
  int i_3;
  int i_2;
  int input_len;
  int dst_index;
  int src_index;
  int iStack_4009c;
  undefined1 auStack_40098 [4];
  int i_1;
  Convolution conv;
  double window;
  double window_x;
  double x;
  int i;
  double input [16384];
  double coeff [16384];
  int half_window_len;
  double initial_value_local;
  double stopband_local;
  StkFrames *dst_local;
  StkFrames *src_local;
  
  for (x._4_4_ = 0; x._4_4_ < 0x4000; x._4_4_ = x._4_4_ + 1) {
    dVar3 = cos(((double)(x._4_4_ + -0x2000) / 8192.0 + 1.0) * 3.141592653589793);
    conv.m_work = (double *)(dVar3 * -0.46 + 0.54);
    dVar3 = sinc((double)(x._4_4_ + -0x2000) * stopband);
    input[(long)x._4_4_ + 0x3fff] = dVar3 * (double)conv.m_work * stopband;
  }
  Convolution::Convolution((Convolution *)auStack_40098,0x4000,input + 0x3fff);
  for (iStack_4009c = 0; iStack_4009c < 0x4000; iStack_4009c = iStack_4009c + 1) {
    input[(long)iStack_4009c + -1] = initial_value;
  }
  Convolution::convolve((Convolution *)auStack_40098,(double *)&stack0xfffffffffffbffc8,0x4000);
  input_len = 0;
  i_2 = -0x2000;
  while (sVar1 = stk::StkFrames::size(src), i_2 < (int)sVar1) {
    sVar1 = stk::StkFrames::size(src);
    i_3 = (int)sVar1 - input_len;
    if (0x4000 < i_3) {
      i_3 = 0x4000;
    }
    if (i_3 < 0) {
      i_3 = 0;
    }
    for (i_4 = 0; i_4 < i_3; i_4 = i_4 + 1) {
      SVar4 = stk::StkFrames::operator[](src,(long)(input_len + i_4));
      input[(long)i_4 + -1] = SVar4;
    }
    for (iStack_400c0 = i_3; iStack_400c0 < 0x4000; iStack_400c0 = iStack_400c0 + 1) {
      input[(long)iStack_400c0 + -1] = 0.0;
    }
    Convolution::convolve((Convolution *)auStack_40098,(double *)&stack0xfffffffffffbffc8,0x4000);
    input_len = i_3 + input_len;
    for (iStack_400c4 = 0; iStack_400c4 < 0x4000; iStack_400c4 = iStack_400c4 + 1) {
      if ((-1 < i_2) && (sVar1 = stk::StkFrames::size(src), i_2 < (int)sVar1)) {
        SVar4 = input[(long)iStack_400c4 + -1];
        pSVar2 = stk::StkFrames::operator[](dst,(long)i_2);
        *pSVar2 = SVar4;
      }
      i_2 = i_2 + 1;
    }
  }
  sVar1 = stk::StkFrames::size(src);
  Convolution::~Convolution((Convolution *)auStack_40098);
  return (int)sVar1;
}

Assistant:

int firLowpassFilter(const stk::StkFrames &src,
					 stk::StkFrames &dst,
					 double stopband,
					 double initial_value)
{
	int		half_window_len = filter_window_len / 2;
	double	coeff[filter_window_len];
	double	input[filter_window_len];
	
	// フィルタ作成
	for (int i=0; i<filter_window_len; ++i) {
		double	x = i - half_window_len;
		double	window_x = x/half_window_len + 1.0;
		double	window = 0.54 - 0.46 * std::cos(M_PI * window_x);
		coeff[i] = sinc(x * stopband) * window * stopband;
	}
	
	Convolution conv(filter_window_len, coeff);

	// initial_valueの反映
	for (int i=0; i<filter_window_len; ++i) {
		input[i] = initial_value;
	}
	conv.convolve(input, filter_window_len);
	
	int src_index = 0;
	int dst_index = -half_window_len;
	
	while (dst_index < static_cast<int>(src.size())) {
		int input_len = static_cast<int>(src.size()) - src_index;
		if (input_len > filter_window_len) {
			input_len = filter_window_len;
		}
		if (input_len < 0) {
			input_len = 0;
		}
		for (int i=0; i<input_len; ++i) {
			input[i] = src[src_index + i];
		}
		for (int i=input_len; i<filter_window_len; ++i) {
			input[i] = 0;
		}
		conv.convolve(input, filter_window_len);
		src_index += input_len;
		
		for (int i=0; i<filter_window_len; ++i) {
			if ((dst_index >= 0) && (dst_index < static_cast<int>(src.size()))) {
				dst[dst_index] = input[i];
			}
			dst_index++;
		}
	}

	return (int)src.size();
}